

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O0

unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
 __thiscall
pstore::index::details::linear_node::allocate
          (linear_node *this,size_t num_children,linear_node *from_node)

{
  address *__last;
  linear_node *this_00;
  unsigned_long *puVar1;
  address *__first;
  pointer plVar2;
  address *src_begin;
  unsigned_long local_48;
  size_t num_to_copy;
  size_t local_30;
  undefined1 local_21;
  linear_node *local_20;
  linear_node *from_node_local;
  size_t num_children_local;
  unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
  *new_node;
  
  local_21 = 0;
  local_30 = num_children;
  local_20 = from_node;
  from_node_local = (linear_node *)num_children;
  num_children_local = (size_t)this;
  this_00 = (linear_node *)operator_new(0x18,(nchildren)num_children);
  linear_node(this_00,(size_t)from_node_local);
  std::
  unique_ptr<pstore::index::details::linear_node,std::default_delete<pstore::index::details::linear_node>>
  ::unique_ptr<std::default_delete<pstore::index::details::linear_node>,void>
            ((unique_ptr<pstore::index::details::linear_node,std::default_delete<pstore::index::details::linear_node>>
              *)this,this_00);
  src_begin = (address *)size(local_20);
  puVar1 = std::min<unsigned_long>((unsigned_long *)&from_node_local,(unsigned_long *)&src_begin);
  local_48 = *puVar1;
  __first = local_20->leaves_;
  __last = __first + local_48;
  plVar2 = std::
           unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
           ::operator->((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                         *)this);
  std::copy<pstore::address_const*,pstore::address*>(__first,__last,plVar2->leaves_);
  return (__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
          )(__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<linear_node> linear_node::allocate (std::size_t const num_children,
                                                                linear_node const & from_node) {
                // Allocate the new node and fill in the basic fields.
                auto new_node = std::unique_ptr<linear_node> (new (nchildren{num_children})
                                                                  linear_node (num_children));

                std::size_t const num_to_copy = std::min (num_children, from_node.size ());
                auto const * const src_begin = from_node.leaves_;
                // Note that the last argument is '&leaves[0]' rather than just 'leaves' to defeat
                // an MSVC debug assertion that thinks it knows how big the leaves_ array is...
                std::copy (src_begin, src_begin + num_to_copy, &new_node->leaves_[0]);

                return new_node;
            }